

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::SetRange
          (CharSet<char16_t> *this,ArenaAllocator *allocator,Char lc,Char hc)

{
  CharBitvec *this_00;
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  CharSetInner *this_01;
  undefined4 extraout_var;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  uint value;
  ulong uVar7;
  uint i;
  uint uVar8;
  uint h;
  undefined **ppuVar9;
  
  uVar7 = CONCAT62(in_register_00000012,lc) & 0xffffffff;
  if ((ushort)(Char)uVar7 <= (ushort)hc) {
    h = (uint)CONCAT62(in_register_0000000a,hc);
    if ((this->rep).compact.countPlusOne - 1 < 5) {
      if (h - (int)CONCAT62(in_register_00000012,lc) < 4) {
        do {
          uVar8 = 0;
          while( true ) {
            uVar4 = GetCompactLength(this);
            value = (uint)uVar7;
            if ((uVar4 <= uVar8) ||
               ((uVar8 < 4 && (uVar4 = GetCompactCharU(this,uVar8), uVar4 == value)))) break;
            uVar8 = uVar8 + 1;
          }
          uVar4 = GetCompactLength(this);
          if (uVar4 == uVar8) {
            if (3 < uVar8) {
              if (h < value) {
                return;
              }
              break;
            }
            AddCompactCharU(this,value);
          }
          uVar7 = (ulong)(value + 1);
          if (value == h) {
            return;
          }
        } while( true );
      }
      SwitchRepresentations(this,allocator);
      if ((this->rep).compact.countPlusOne - 1 < 5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,1099,"(!IsCompact())","!IsCompact()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
    uVar8 = (uint)uVar7;
    if (hc == L'\xffff' && uVar8 == 0) {
      CharBitvec::SetRange(&(this->rep).full.direct,0,0xff);
      pCVar1 = (this->rep).full.root;
      ppuVar9 = &CharSetFull::Instance;
      if (pCVar1 != (CharSetNode *)0x0) {
        (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
      }
    }
    else {
      if (uVar8 < 0x100) {
        this_00 = &(this->rep).full.direct;
        if ((ushort)hc < 0x100) {
          CharBitvec::SetRange(this_00,uVar8,h);
          return;
        }
        CharBitvec::SetRange(this_00,uVar8,0xff);
        uVar7 = 0x100;
      }
      this_01 = (CharSetInner *)(this->rep).full.root;
      if (this_01 == (CharSetInner *)0x0) {
        this_01 = (CharSetInner *)new<Memory::ArenaAllocator>(0x88,allocator,0x35916e);
        CharSetInner::CharSetInner(this_01);
        (this->rep).full.root = (CharSetNode *)this_01;
      }
      iVar5 = (*(this_01->super_CharSetNode)._vptr_CharSetNode[2])
                        (this_01,allocator,2,uVar7,CONCAT62(in_register_0000000a,hc) & 0xffffffff);
      ppuVar9 = (undefined **)CONCAT44(extraout_var,iVar5);
    }
    (this->rep).full.root = (CharSetNode *)ppuVar9;
  }
  return;
}

Assistant:

void CharSet<char16>::SetRange(ArenaAllocator* allocator, Char lc, Char hc)
    {
        uint l = CTU(lc);
        uint h = CTU(hc);
        if (h < l)
            return;

        if (IsCompact())
        {
            if (h - l < MaxCompact)
            {
                do
                {
                    uint i;
                    for (i = 0; i < this->GetCompactLength(); i++)
                    {
                        __assume(l <= MaxUChar);
                        if (l <= MaxUChar && i < MaxCompact)
                        {
                            if (this->GetCompactCharU(i) == l)
                                break;
                        }
                    }
                    if (i == this->GetCompactLength())
                    {
                        // Character not already in compact set
                        if (i < MaxCompact)
                        {
                            this->AddCompactCharU(l);
                        }
                        else
                            // Must switch representations
                            break;
                    }
                    l++;
                }
                while (l <= h);
                if (h < l)
                    // All chars are now in compact set
                    return;
                // else: fall-through to general case for remaining chars
            }
            // else: no use even trying

            SwitchRepresentations(allocator);
        }

        Assert(!IsCompact());

        if (l == 0 && h == MaxUChar)
        {
            rep.full.direct.SetRange(0, CharSetNode::directSize - 1);
            if (rep.full.root != nullptr)
                rep.full.root->FreeSelf(allocator);
            rep.full.root = CharSetFull::TheFullNode;
        }
        else
        {
            if (l < CharSetNode::directSize)
            {
                if (h < CharSetNode::directSize)
                {
                    rep.full.direct.SetRange(l, h);
                    return;
                }
                rep.full.direct.SetRange(l, CharSetNode::directSize - 1);
                l = CharSetNode::directSize;
            }

            if (rep.full.root == nullptr)
                rep.full.root = Anew(allocator, CharSetInner);
            rep.full.root = rep.full.root->Set(allocator, CharSetNode::levels - 1, l, h);
        }
    }